

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

bool open_prog_sewer_casket(OBJ_DATA *obj,CHAR_DATA *ch)

{
  CHAR_DATA *arg2;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var1;
  CHAR_DATA *skeleton;
  ROOM_INDEX_DATA *in_stack_00000018;
  CHAR_DATA *in_stack_00000020;
  MOB_INDEX_DATA *in_stack_000000c0;
  char *in_stack_00002498;
  CHAR_DATA *in_stack_000024a0;
  void *in_stack_ffffffffffffffe8;
  
  _Var1 = std::pow<int,int>(0,0x66735a);
  *(uint *)&in_RDI->prompt = *(uint *)&in_RDI->prompt & ((uint)(long)_Var1 ^ 0xffffffff);
  send_to_char((char *)skeleton,in_RDI);
  act((char *)skeleton,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
  get_mob_index((int)((ulong)in_RDI >> 0x20));
  arg2 = create_mobile(in_stack_000000c0);
  char_to_room(in_stack_00000020,in_stack_00000018);
  act((char *)skeleton,in_RDI,in_RSI,arg2,0);
  act((char *)skeleton,in_RDI,in_RSI,arg2,0);
  act((char *)skeleton,in_RDI,in_RSI,arg2,0);
  do_murder(in_stack_000024a0,in_stack_00002498);
  return false;
}

Assistant:

bool open_prog_sewer_casket(OBJ_DATA *obj, CHAR_DATA *ch)
{
	CHAR_DATA *skeleton;

	REMOVE_BIT_OLD(obj->value[1], CONT_CLOSED);

	send_to_char("You slide the heavy lid off the stone burial casket.\n\r", ch);
	act("$n slides the heavy lid off the stone burial casket.", ch, 0, 0, TO_ROOM);

	skeleton = create_mobile(get_mob_index(2200));

	char_to_room(skeleton, ch->in_room);
	act("Dust fills the burial chamber, and as it clears....", ch, 0, 0, TO_ALL);
	act("$N rises out of the casket and lunges at you!", ch, 0, skeleton, TO_CHAR);
	act("$N rises out of the casket and lunges at $n!", ch, 0, skeleton, TO_ROOM);

	do_murder(skeleton, ch->name);

	return false;
}